

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int64_t mtree_atol(char **p)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  int64_t iVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  ulong uStack_8;
  
  pcVar2 = *p;
  if (*pcVar2 != '0') {
    pcVar2 = *p;
    cVar1 = *pcVar2;
    if (cVar1 == '-') {
      pcVar2 = pcVar2 + 1;
      *p = pcVar2;
      uStack_8 = 8;
    }
    else {
      uStack_8 = 7;
    }
    lVar3 = 0;
    while( true ) {
      uVar10 = (int)*pcVar2 - 0x30;
      if (9 < uVar10) {
        lVar7 = -lVar3;
        if (cVar1 != '-') {
          lVar7 = lVar3;
        }
        return lVar7;
      }
      if ((0xccccccccccccccc < lVar3) || (uStack_8 < uVar10 && lVar3 == 0xccccccccccccccc)) break;
      lVar3 = lVar3 * 10 + (ulong)uVar10;
      *p = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    }
    iVar4 = -0x8000000000000000;
    if (cVar1 != '-') {
      iVar4 = 0x7fffffffffffffff;
    }
    return iVar4;
  }
  if ((byte)(pcVar2[1] | 0x20U) != 0x78) {
    lVar3 = 0;
    pcVar2 = *p;
    while( true ) {
      if (7 < (int)*pcVar2 - 0x30U) {
        return lVar3;
      }
      if (0xfffffffffffffff < lVar3) break;
      lVar3 = (ulong)((int)*pcVar2 - 0x30U) + lVar3 * 8;
      *p = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    }
    return 0x7fffffffffffffff;
  }
  lVar3 = 0x7ffffffffffffff;
  pcVar5 = pcVar2 + 2;
  *p = pcVar5;
  cVar1 = pcVar2[2];
  if (cVar1 == '-') {
    pcVar5 = pcVar2 + 3;
    *p = pcVar5;
    lVar3 = 0x800000000000000;
    uVar6 = 0;
    cVar8 = pcVar2[3];
  }
  else {
    uVar6 = 0xf;
    cVar8 = cVar1;
  }
  lVar7 = 0;
  while( true ) {
    pcVar5 = pcVar5 + 1;
    iVar9 = (int)cVar8;
    if ((byte)(cVar8 - 0x30U) < 10) {
      uVar10 = iVar9 - 0x30;
    }
    else if ((byte)(cVar8 + 0x9fU) < 6) {
      uVar10 = iVar9 - 0x61;
    }
    else {
      if (5 < (byte)(cVar8 + 0xbfU)) break;
      uVar10 = iVar9 - 0x41;
    }
    if ((int)uVar10 < 0) break;
    if ((lVar7 != lVar3 && lVar3 <= lVar7) || (uVar6 < uVar10 && lVar7 == lVar3)) {
      iVar4 = -0x8000000000000000;
      if (cVar1 != '-') {
        iVar4 = 0x7fffffffffffffff;
      }
      return iVar4;
    }
    lVar7 = lVar7 * 0x10 + (ulong)uVar10;
    *p = pcVar5;
    cVar8 = *pcVar5;
  }
  lVar3 = -lVar7;
  if (cVar1 != '-') {
    lVar3 = lVar7;
  }
  return lVar3;
}

Assistant:

static int64_t
mtree_atol(char **p)
{
	if (**p != '0')
		return mtree_atol10(p);
	if ((*p)[1] == 'x' || (*p)[1] == 'X') {
		*p += 2;
		return mtree_atol16(p);
	}
	return mtree_atol8(p);
}